

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd.c
# Opt level: O2

void nsh_cmd_swap(nsh_cmd_t *cmd1,nsh_cmd_t *cmd2)

{
  nsh_cmd_t temp;
  nsh_cmd_t local_30;
  
  nsh_cmd_copy(&local_30,cmd1);
  nsh_cmd_copy(cmd1,cmd2);
  nsh_cmd_copy(cmd2,&local_30);
  return;
}

Assistant:

void nsh_cmd_swap(nsh_cmd_t* cmd1, nsh_cmd_t* cmd2)
{
    nsh_cmd_t temp;
    nsh_cmd_copy(&temp, cmd1);
    nsh_cmd_copy(cmd1, cmd2);
    nsh_cmd_copy(cmd2, &temp);
}